

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

void read_pop(macros *ma)

{
  wchar_t wVar1;
  long lVar2;
  
  free(*ma->macro);
  wVar1 = ma->level;
  if (0 < (long)wVar1) {
    lVar2 = 0;
    do {
      ma->macro[lVar2] = ma->macro[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (wVar1 != lVar2);
  }
  ma->level = wVar1 + L'\xffffffff';
  ma->offset = L'\0';
  return;
}

Assistant:

static void
read_pop(struct macros *ma)
{
	int i;

	el_free(ma->macro[0]);
	for (i = 0; i < ma->level; i++)
		ma->macro[i] = ma->macro[i + 1];
	ma->level--;
	ma->offset = 0;
}